

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LoopBreakLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loopbreak(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x26c) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x26c;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.loopbreak_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LoopBreakLayerParams>
                   (arena);
    (this->layer_).loopbreak_ = (LoopBreakLayerParams *)LVar2;
  }
  return (LoopBreakLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopBreakLayerParams* NeuralNetworkLayer::_internal_mutable_loopbreak() {
  if (!_internal_has_loopbreak()) {
    clear_layer();
    set_has_loopbreak();
    layer_.loopbreak_ = CreateMaybeMessage< ::CoreML::Specification::LoopBreakLayerParams >(GetArenaForAllocation());
  }
  return layer_.loopbreak_;
}